

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fkLookupParent(Parse *pParse,int iDb,Table *pTab,Index *pIdx,FKey *pFKey,int *aiCol,int regData
                   ,int nIncr,int isIgnore)

{
  int p1;
  uint uVar1;
  byte bVar2;
  uint p2;
  int iVar3;
  uint uVar4;
  Vdbe *p;
  Parse *pPVar5;
  KeyInfo *zP4;
  char *zP4_00;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  int local_6c;
  
  p = sqlite3GetVdbe(pParse);
  iVar7 = pParse->nTab;
  p2 = sqlite3VdbeMakeLabel(p);
  if (nIncr < 0) {
    sqlite3VdbeAddOp3(p,0x76,(uint)pFKey->isDeferred,p2,0);
  }
  uVar6 = (ulong)(uint)pFKey->nCol;
  if (0 < pFKey->nCol) {
    lVar10 = 0;
    do {
      sqlite3VdbeAddOp3(p,0x49,aiCol[lVar10] + regData + 1,p2,0);
      lVar10 = lVar10 + 1;
      uVar6 = (ulong)pFKey->nCol;
    } while (lVar10 < (long)uVar6);
  }
  iVar7 = iVar7 + -1;
  if (isIgnore == 0) {
    if (pIdx == (Index *)0x0) {
      if (pParse->nTempReg == '\0') {
        iVar11 = pParse->nMem + 1;
        pParse->nMem = iVar11;
      }
      else {
        bVar2 = pParse->nTempReg - 1;
        pParse->nTempReg = bVar2;
        iVar11 = pParse->aTempReg[bVar2];
      }
      sqlite3VdbeAddOp3(p,0xf,regData + *aiCol + 1,iVar11,0);
      uVar4 = sqlite3VdbeAddOp3(p,0x15,iVar11,0,0);
      if ((nIncr == 1) && (pFKey->pFrom == pTab)) {
        sqlite3VdbeAddOp3(p,0x4c,regData,p2,iVar11);
      }
      sqlite3OpenTable(pParse,iVar7,iDb,pTab,0x27);
      sqlite3VdbeAddOp3(p,0x36,iVar7,0,iVar11);
      sqlite3VdbeAddOp3(p,1,0,p2,0);
      uVar1 = p->nOp;
      if (1 < (int)uVar1) {
        p->aOp[uVar1 - 2].p2 = uVar1;
      }
      if (uVar4 < uVar1 && -1 < (int)uVar4) {
        p->aOp[uVar4].p2 = uVar1;
      }
      if (iVar11 != 0) {
        bVar2 = pParse->nTempReg;
        if ((ulong)bVar2 < 8) {
          lVar10 = 0;
          do {
            if (*(int *)((long)&pParse->aColCache[0].iReg + lVar10) == iVar11) {
              (&pParse->aColCache[0].tempReg)[lVar10] = '\x01';
              goto LAB_0016f531;
            }
            lVar10 = lVar10 + 0x18;
          } while ((int)lVar10 != 0xf0);
          pParse->nTempReg = bVar2 + 1;
          pParse->aTempReg[bVar2] = iVar11;
        }
      }
    }
    else {
      iVar11 = (int)uVar6;
      if (pParse->nRangeReg < iVar11) {
        p1 = pParse->nMem + 1;
        pParse->nMem = pParse->nMem + iVar11;
      }
      else {
        p1 = pParse->iRangeReg;
        pParse->iRangeReg = p1 + iVar11;
        pParse->nRangeReg = pParse->nRangeReg - iVar11;
      }
      if (pParse->nTempReg == '\0') {
        local_6c = pParse->nMem + 1;
        pParse->nMem = local_6c;
      }
      else {
        bVar2 = pParse->nTempReg - 1;
        pParse->nTempReg = bVar2;
        local_6c = pParse->aTempReg[bVar2];
      }
      zP4 = sqlite3IndexKeyinfo(pParse,pIdx);
      sqlite3VdbeAddOp3(p,0x27,iVar7,pIdx->tnum,iDb);
      sqlite3VdbeChangeP4(p,-1,(char *)zP4,-0x10);
      if (0 < iVar11) {
        uVar8 = 0;
        do {
          sqlite3VdbeAddOp3(p,0xe,aiCol[uVar8] + regData + 1,(int)uVar8 + p1,0);
          uVar8 = uVar8 + 1;
        } while ((uVar6 & 0xffffffff) != uVar8);
      }
      if ((nIncr == 1) && (pFKey->pFrom == pTab)) {
        if (0 < iVar11) {
          iVar3 = p->nOp;
          uVar8 = 0;
          do {
            iVar9 = pIdx->aiColumn[uVar8] + 1;
            if (pIdx->aiColumn[uVar8] == (int)pTab->iPKey) {
              iVar9 = 0;
            }
            sqlite3VdbeAddOp3(p,0x4b,aiCol[uVar8] + regData + 1,iVar3 + iVar11 + 1,iVar9 + regData);
            if (p->aOp != (Op *)0x0) {
              p->aOp[(long)p->nOp + -1].p5 = '\b';
            }
            uVar8 = uVar8 + 1;
          } while ((uVar6 & 0xffffffff) != uVar8);
        }
        sqlite3VdbeAddOp3(p,1,0,p2,0);
      }
      sqlite3VdbeAddOp3(p,0x1f,p1,iVar11,local_6c);
      zP4_00 = sqlite3IndexAffinityStr(p,pIdx);
      sqlite3VdbeChangeP4(p,-1,zP4_00,0);
      iVar3 = sqlite3VdbeAddOp3(p,0x34,iVar7,p2,local_6c);
      sqlite3VdbeChangeP4(p,iVar3,(char *)0x0,-0xe);
      if (local_6c != 0) {
        bVar2 = pParse->nTempReg;
        if ((ulong)bVar2 < 8) {
          lVar10 = 0;
          do {
            if (*(int *)((long)&pParse->aColCache[0].iReg + lVar10) == local_6c) {
              (&pParse->aColCache[0].tempReg)[lVar10] = '\x01';
              goto LAB_0016f9a5;
            }
            lVar10 = lVar10 + 0x18;
          } while ((int)lVar10 != 0xf0);
          pParse->nTempReg = bVar2 + 1;
          pParse->aTempReg[bVar2] = local_6c;
        }
      }
LAB_0016f9a5:
      sqlite3ExprCacheRemove(pParse,p1,iVar11);
      if (pParse->nRangeReg < iVar11) {
        pParse->nRangeReg = iVar11;
        pParse->iRangeReg = p1;
      }
    }
  }
LAB_0016f531:
  bVar2 = pFKey->isDeferred;
  if (((bVar2 == 0) && (pParse->pToplevel == (Parse *)0x0)) && (pParse->isMultiWrite == '\0')) {
    sqlite3HaltConstraint(pParse,0x313,2,"foreign key constraint failed",-2);
  }
  else {
    if (0 < nIncr && bVar2 == 0) {
      pPVar5 = pParse->pToplevel;
      if (pParse->pToplevel == (Parse *)0x0) {
        pPVar5 = pParse;
      }
      pPVar5->mayAbort = '\x01';
    }
    sqlite3VdbeAddOp3(p,0x75,(uint)bVar2,nIncr,0);
  }
  if (p->aLabel != (int *)0x0) {
    p->aLabel[(int)~p2] = p->nOp;
  }
  sqlite3VdbeAddOp3(p,0x2d,iVar7,0,0);
  return;
}

Assistant:

static void fkLookupParent(
  Parse *pParse,        /* Parse context */
  int iDb,              /* Index of database housing pTab */
  Table *pTab,          /* Parent table of FK pFKey */
  Index *pIdx,          /* Unique index on parent key columns in pTab */
  FKey *pFKey,          /* Foreign key constraint */
  int *aiCol,           /* Map from parent key columns to child table columns */
  int regData,          /* Address of array containing child table row */
  int nIncr,            /* Increment constraint counter by this */
  int isIgnore          /* If true, pretend pTab contains all NULL values */
){
  int i;                                    /* Iterator variable */
  Vdbe *v = sqlite3GetVdbe(pParse);         /* Vdbe to add code to */
  int iCur = pParse->nTab - 1;              /* Cursor number to use */
  int iOk = sqlite3VdbeMakeLabel(v);        /* jump here if parent key found */

  /* If nIncr is less than zero, then check at runtime if there are any
  ** outstanding constraints to resolve. If there are not, there is no need
  ** to check if deleting this row resolves any outstanding violations.
  **
  ** Check if any of the key columns in the child table row are NULL. If 
  ** any are, then the constraint is considered satisfied. No need to 
  ** search for a matching row in the parent table.  */
  if( nIncr<0 ){
    sqlite3VdbeAddOp2(v, OP_FkIfZero, pFKey->isDeferred, iOk);
  }
  for(i=0; i<pFKey->nCol; i++){
    int iReg = aiCol[i] + regData + 1;
    sqlite3VdbeAddOp2(v, OP_IsNull, iReg, iOk);
  }

  if( isIgnore==0 ){
    if( pIdx==0 ){
      /* If pIdx is NULL, then the parent key is the INTEGER PRIMARY KEY
      ** column of the parent table (table pTab).  */
      int iMustBeInt;               /* Address of MustBeInt instruction */
      int regTemp = sqlite3GetTempReg(pParse);
  
      /* Invoke MustBeInt to coerce the child key value to an integer (i.e. 
      ** apply the affinity of the parent key). If this fails, then there
      ** is no matching parent key. Before using MustBeInt, make a copy of
      ** the value. Otherwise, the value inserted into the child key column
      ** will have INTEGER affinity applied to it, which may not be correct.  */
      sqlite3VdbeAddOp2(v, OP_SCopy, aiCol[0]+1+regData, regTemp);
      iMustBeInt = sqlite3VdbeAddOp2(v, OP_MustBeInt, regTemp, 0);
  
      /* If the parent table is the same as the child table, and we are about
      ** to increment the constraint-counter (i.e. this is an INSERT operation),
      ** then check if the row being inserted matches itself. If so, do not
      ** increment the constraint-counter.  */
      if( pTab==pFKey->pFrom && nIncr==1 ){
        sqlite3VdbeAddOp3(v, OP_Eq, regData, iOk, regTemp);
      }
  
      sqlite3OpenTable(pParse, iCur, iDb, pTab, OP_OpenRead);
      sqlite3VdbeAddOp3(v, OP_NotExists, iCur, 0, regTemp);
      sqlite3VdbeAddOp2(v, OP_Goto, 0, iOk);
      sqlite3VdbeJumpHere(v, sqlite3VdbeCurrentAddr(v)-2);
      sqlite3VdbeJumpHere(v, iMustBeInt);
      sqlite3ReleaseTempReg(pParse, regTemp);
    }else{
      int nCol = pFKey->nCol;
      int regTemp = sqlite3GetTempRange(pParse, nCol);
      int regRec = sqlite3GetTempReg(pParse);
      KeyInfo *pKey = sqlite3IndexKeyinfo(pParse, pIdx);
  
      sqlite3VdbeAddOp3(v, OP_OpenRead, iCur, pIdx->tnum, iDb);
      sqlite3VdbeChangeP4(v, -1, (char*)pKey, P4_KEYINFO_HANDOFF);
      for(i=0; i<nCol; i++){
        sqlite3VdbeAddOp2(v, OP_Copy, aiCol[i]+1+regData, regTemp+i);
      }
  
      /* If the parent table is the same as the child table, and we are about
      ** to increment the constraint-counter (i.e. this is an INSERT operation),
      ** then check if the row being inserted matches itself. If so, do not
      ** increment the constraint-counter. 
      **
      ** If any of the parent-key values are NULL, then the row cannot match 
      ** itself. So set JUMPIFNULL to make sure we do the OP_Found if any
      ** of the parent-key values are NULL (at this point it is known that
      ** none of the child key values are).
      */
      if( pTab==pFKey->pFrom && nIncr==1 ){
        int iJump = sqlite3VdbeCurrentAddr(v) + nCol + 1;
        for(i=0; i<nCol; i++){
          int iChild = aiCol[i]+1+regData;
          int iParent = pIdx->aiColumn[i]+1+regData;
          assert( aiCol[i]!=pTab->iPKey );
          if( pIdx->aiColumn[i]==pTab->iPKey ){
            /* The parent key is a composite key that includes the IPK column */
            iParent = regData;
          }
          sqlite3VdbeAddOp3(v, OP_Ne, iChild, iJump, iParent);
          sqlite3VdbeChangeP5(v, SQLITE_JUMPIFNULL);
        }
        sqlite3VdbeAddOp2(v, OP_Goto, 0, iOk);
      }
  
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regTemp, nCol, regRec);
      sqlite3VdbeChangeP4(v, -1, sqlite3IndexAffinityStr(v,pIdx), P4_TRANSIENT);
      sqlite3VdbeAddOp4Int(v, OP_Found, iCur, iOk, regRec, 0);
  
      sqlite3ReleaseTempReg(pParse, regRec);
      sqlite3ReleaseTempRange(pParse, regTemp, nCol);
    }
  }

  if( !pFKey->isDeferred && !pParse->pToplevel && !pParse->isMultiWrite ){
    /* Special case: If this is an INSERT statement that will insert exactly
    ** one row into the table, raise a constraint immediately instead of
    ** incrementing a counter. This is necessary as the VM code is being
    ** generated for will not open a statement transaction.  */
    assert( nIncr==1 );
    sqlite3HaltConstraint(pParse, SQLITE_CONSTRAINT_FOREIGNKEY,
        OE_Abort, "foreign key constraint failed", P4_STATIC
    );
  }else{
    if( nIncr>0 && pFKey->isDeferred==0 ){
      sqlite3ParseToplevel(pParse)->mayAbort = 1;
    }
    sqlite3VdbeAddOp2(v, OP_FkCounter, pFKey->isDeferred, nIncr);
  }

  sqlite3VdbeResolveLabel(v, iOk);
  sqlite3VdbeAddOp1(v, OP_Close, iCur);
}